

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeTestCase.cpp
# Opt level: O2

void __thiscall xe::TestSet::removeGroup(TestSet *this,TestGroup *testGroup)

{
  TestGroup *group;
  iterator iVar1;
  TestGroup *local_18;
  
  local_18 = testGroup;
  iVar1 = std::
          _Rb_tree<const_xe::TestNode_*,_const_xe::TestNode_*,_std::_Identity<const_xe::TestNode_*>,_std::less<const_xe::TestNode_*>,_std::allocator<const_xe::TestNode_*>_>
          ::find((_Rb_tree<const_xe::TestNode_*,_const_xe::TestNode_*,_std::_Identity<const_xe::TestNode_*>,_std::less<const_xe::TestNode_*>,_std::allocator<const_xe::TestNode_*>_>
                  *)this,(key_type *)&local_18);
  if (iVar1._M_node != (_Base_ptr)(this + 8)) {
    local_18 = testGroup;
    std::
    _Rb_tree<const_xe::TestNode_*,_const_xe::TestNode_*,_std::_Identity<const_xe::TestNode_*>,_std::less<const_xe::TestNode_*>,_std::allocator<const_xe::TestNode_*>_>
    ::erase((_Rb_tree<const_xe::TestNode_*,_const_xe::TestNode_*,_std::_Identity<const_xe::TestNode_*>,_std::less<const_xe::TestNode_*>,_std::allocator<const_xe::TestNode_*>_>
             *)this,(key_type *)&local_18);
    removeChildren((set<const_xe::TestNode_*,_std::less<const_xe::TestNode_*>,_std::allocator<const_xe::TestNode_*>_>
                    *)this,testGroup);
    group = (testGroup->super_TestNode).m_parent;
    if (group != (TestGroup *)0x0) {
      removeEmptyGroups((set<const_xe::TestNode_*,_std::less<const_xe::TestNode_*>,_std::allocator<const_xe::TestNode_*>_>
                         *)this,group);
    }
  }
  return;
}

Assistant:

void TestSet::removeGroup (const TestGroup* testGroup)
{
	if (m_set.find(testGroup) != m_set.end())
	{
		m_set.erase(testGroup);
		removeChildren(m_set, testGroup);
		if (testGroup->getParent() != DE_NULL)
			removeEmptyGroups(m_set, testGroup->getParent());
	}
}